

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loopsops.c
# Opt level: O0

LispPTR lcfuncall(uint atom_index,int argnum,int bytenum)

{
  DLword *pDVar1;
  LispPTR LVar2;
  LispPTR *pLVar3;
  uint *local_40;
  int local_34;
  LispPTR test;
  int rest;
  fnhead *tmp_fn;
  short pv_num;
  definition_cell *defcell68k;
  int bytenum_local;
  int argnum_local;
  uint atom_index_local;
  
  if (atom_index == 0xffffffff) {
    error("Loops punt to nonexistent fn");
  }
  LVar2 = LAddrFromNative(MachineState.csp);
  MachineState.pvar[-5] = (short)LVar2 + (short)argnum * -2 + 4;
  MachineState.ivar = NativeAligned2FromStackOffset(MachineState.pvar[-5]);
  MachineState.pvar[-6] =
       ((short)MachineState.currentpc - (short)MachineState.currentfunc) + (short)bytenum;
  MachineState.csp = MachineState.csp + 2;
  *(LispPTR *)MachineState.csp = MachineState.tosvalue;
  if ((atom_index & 0xfff0000) == 0) {
    pLVar3 = (LispPTR *)(AtomSpace + (ulong)(atom_index * 5) * 2);
  }
  else {
    pLVar3 = NativeAligned4FromLAddr(atom_index);
  }
  local_40 = pLVar3 + 2;
  MachineState.currentfunc = (fnhead *)NativeAligned4FromLAddr(*local_40 & 0xfffffff);
  if (-1 < (MachineState.currentfunc)->na) {
    for (local_34 = argnum - (MachineState.currentfunc)->na; local_34 < 0; local_34 = local_34 + 1)
    {
      MachineState.csp = MachineState.csp + 2;
      pDVar1 = MachineState.csp + 1;
      MachineState.csp[0] = 0;
      *pDVar1 = 0;
    }
    MachineState.csp = MachineState.csp + -(long)(local_34 << 1);
  }
  MachineState.csp = MachineState.csp + 2;
  *(undefined2 *)((ulong)MachineState.csp ^ 2) = 0x8000;
  *(DLword *)((ulong)(MachineState.csp + 1) ^ 2) = MachineState.pvar[-5];
  MachineState.csp = MachineState.csp + 2;
  *(undefined2 *)((ulong)MachineState.csp ^ 2) = 0xc000;
  LVar2 = LAddrFromNative(MachineState.pvar);
  *MachineState.csp = (DLword)LVar2;
  MachineState.pvar = MachineState.csp + 10;
  *(uint *)(MachineState.csp + 2) = *local_40 & 0xfffffff;
  MachineState.csp = MachineState.pvar;
  for (tmp_fn._6_2_ = (MachineState.currentfunc)->pv + 1; 0 < tmp_fn._6_2_;
      tmp_fn._6_2_ = tmp_fn._6_2_ + -1) {
    pDVar1 = MachineState.csp;
    pDVar1[0] = 0;
    pDVar1[1] = 0xffff;
    MachineState.csp = MachineState.csp + 2;
    pDVar1 = MachineState.csp + 1;
    MachineState.csp[0] = 0;
    *pDVar1 = 0xffff;
    MachineState.csp = MachineState.csp + 2;
  }
  MachineState.currentpc =
       (ByteCode *)
       ((long)&(MachineState.currentfunc)->na + (long)(int)(uint)(MachineState.currentfunc)->startpc
       );
  return 0xfffffffe;
}

Assistant:

LispPTR lcfuncall(unsigned int atom_index, int argnum, int bytenum)
/* Atomindex for Function to invoke */
/* Number of ARGS on TOS and STK */
/* Number of bytes of Caller's
   OPCODE(including multi-byte) */
{
  struct definition_cell *defcell68k; /* Definition Cell PTR */
  short pv_num;                       /* scratch for pv */
  struct fnhead *tmp_fn;
  int rest; /* use for alignments */

  if (atom_index == 0xffffffff) error("Loops punt to nonexistent fn");

  /* Get Next Block offset from argnum */
  CURRENTFX->nextblock = (LAddrFromNative(CurrentStackPTR) & 0x0ffff) - (argnum << 1) + 4 /* +3  */;

  /* Setup IVar */
  IVar = NativeAligned2FromStackOffset(CURRENTFX->nextblock);

  /* Set PC to the Next Instruction and save into FX */
  CURRENTFX->pc = ((UNSIGNED)PC - (UNSIGNED)FuncObj) + bytenum;

  PushCStack; /* save TOS */

  /* Get DEFCELL 68k address */
  defcell68k = (struct definition_cell *)GetDEFCELL68k(atom_index);

  tmp_fn = (struct fnhead *)NativeAligned4FromLAddr(defcell68k->defpointer);

  if ((UNSIGNED)(CurrentStackPTR + tmp_fn->stkmin + STK_SAFE) >= (UNSIGNED)EndSTKP) {
    LispPTR test;
    test = *((LispPTR *)CurrentStackPTR);
    /* DOSTACKOVERFLOW(argnum,bytenum-1); XXX until we figure out what should be happening */
    S_CHECK(test == *((LispPTR *)CurrentStackPTR), "overflow in ccfuncall");
  }
  FuncObj = tmp_fn;

  if (FuncObj->na >= 0) {
    /* This Function is Spread Type */
    /* Arguments on Stack Adjustment  */
    rest = argnum - FuncObj->na;

    while (rest < 0) {
      PushStack(NIL_PTR);
      rest++;
    }
    CurrentStackPTR -= (rest << 1);
  } /* if end */

  /* Set up BF */
  CurrentStackPTR += 2;
  GETWORD(CurrentStackPTR) = BF_MARK;
  GETWORD(CurrentStackPTR + 1) = CURRENTFX->nextblock;
  CurrentStackPTR += 2;

  /* Set up FX */
  GETWORD(CurrentStackPTR) = FX_MARK;

  /* Now SET new FX */
  ((struct frameex1 *)CurrentStackPTR)->alink = LAddrFromNative(PVar);
  PVar = (DLword *)CurrentStackPTR + FRAMESIZE;
#ifdef BIGVM
  ((struct frameex1 *)CurrentStackPTR)->fnheader = (defcell68k->defpointer);
#else
  ((struct frameex1 *)CurrentStackPTR)->lofnheader = (defcell68k->defpointer) & 0x0ffff;
  ((struct frameex1 *)CurrentStackPTR)->hi2fnheader = ((defcell68k->defpointer) & SEGMASK) >> 16;
  ((struct frameex1 *)CurrentStackPTR)->hi1fnheader = 0;
#endif /* BIGVM */

  CurrentStackPTR = PVar;

  /* Set up PVar area */
  pv_num = FuncObj->pv + 1; /* Changed Apr.27 */

  while (pv_num > 0) {
    *((LispPTR *)CurrentStackPTR) = 0x0ffff0000;
    CurrentStackPTR += DLWORDSPER_CELL;
    *((LispPTR *)CurrentStackPTR) = 0x0ffff0000;
    CurrentStackPTR += DLWORDSPER_CELL;
    pv_num--;
  }

  /* Set PC points New Function's first OPCODE */
  PC = (ByteCode *)FuncObj + FuncObj->startpc;

  return -2; /* signal to OP_miscn to leave stack & pc alone */
}